

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilteringRegister.hpp
# Opt level: O2

int __thiscall
supermap::
FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>::clone
          (FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>
           *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__args_1;
  anon_class_16_1_552cbcb6 local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  __args_1 = &local_30.filter.
              super___shared_ptr<supermap::Filter<supermap::Key<1UL>_>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
  std::__shared_ptr<supermap::Filter<supermap::Key<1UL>_>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<supermap::Filter<supermap::Key<1UL>_>,_(__gnu_cxx::_Lock_policy)2> *)
             __args_1,(__shared_ptr<supermap::Filter<supermap::Key<1UL>_>,_(__gnu_cxx::_Lock_policy)2>
                       *)(__fn + 8));
  std::
  make_unique<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,supermap::Key<1ul>>,supermap::FilteringRegister<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,supermap::Key<1ul>>::clone()const::_lambda()_1_,std::function<supermap::Key<1ul>(supermap::KeyValue<supermap::Key<1ul>,unsigned_long>const&)>const&>
            (&local_30,
             (function<supermap::Key<1UL>_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&)>
              *)__args_1);
  (this->
  super_StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
  ).
  super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>_>
  ._vptr_Cloneable =
       (_func_int **)
       local_30.filter.
       super___shared_ptr<supermap::Filter<supermap::Key<1UL>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_30.filter.
  super___shared_ptr<supermap::Filter<supermap::Key<1UL>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  return (int)this;
}

Assistant:

std::unique_ptr<StorageItemRegister<RegisterT, std::shared_ptr<FilterBase>>>
    clone() const override {
        return std::make_unique<FilteringRegister<RegisterT, FilterT>>(
            [filter = filter_]() { return filter->clone(); },
            func_
        );
    }